

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O3

int XLearnSetInt(XL *out,char *key,int value)

{
  XL pvVar1;
  int iVar2;
  long lVar3;
  
  pvVar1 = *out;
  if ((*key == 'k') && (key[1] == '\0')) {
    lVar3 = 0xc0;
  }
  else {
    iVar2 = strcmp(key,"epoch");
    if (iVar2 == 0) {
      lVar3 = 0xb0;
    }
    else {
      iVar2 = strcmp(key,"fold");
      if (iVar2 == 0) {
        lVar3 = 0x1f0;
      }
      else {
        iVar2 = strcmp(key,"block_size");
        if (iVar2 == 0) {
          lVar3 = 0x1e0;
        }
        else {
          iVar2 = strcmp(key,"nthread");
          if (iVar2 == 0) {
            lVar3 = 0x68;
          }
          else {
            iVar2 = strcmp(key,"stop_window");
            if (iVar2 == 0) {
              lVar3 = 0x1f8;
            }
            else {
              iVar2 = strcmp(key,"seed");
              if (iVar2 != 0) {
                return 0;
              }
              lVar3 = 0x1e8;
            }
          }
        }
      }
    }
  }
  *(int *)((long)pvVar1 + lVar3) = value;
  return 0;
}

Assistant:

XL_DLL int XLearnSetInt(XL *out, const char *key, const int value) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "k") == 0) {
    xl->GetHyperParam().num_K = value;
  } else if (strcmp(key, "epoch") == 0) {
    xl->GetHyperParam().num_epoch = value;
  } else if (strcmp(key, "fold") == 0) {
    xl->GetHyperParam().num_folds = value;
  } else if (strcmp(key, "block_size") == 0) {
    xl->GetHyperParam().block_size = value;
  } else if (strcmp(key, "nthread") == 0) {
    xl->GetHyperParam().thread_number = value;
  } else if (strcmp(key, "stop_window") == 0) {
    xl->GetHyperParam().stop_window = value;
  } else if (strcmp(key, "seed") == 0) {
    xl->GetHyperParam().seed = value;
  }
  API_END();
}